

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outer_join_marker.cpp
# Opt level: O0

void __thiscall duckdb::OuterJoinMarker::Initialize(OuterJoinMarker *this,idx_t count_p)

{
  idx_t in_RSI;
  OuterJoinMarker *in_RDI;
  unique_ptr<bool[],_std::default_delete<bool>,_false> *in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe8;
  
  if ((*(byte *)&(((unique_ptr<bool[],_std::default_delete<bool[]>_> *)&in_RDI->enabled)->_M_t).
                 super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                 super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                 super__Head_base<0UL,_bool_*,_false>._M_head_impl & 1) != 0) {
    in_RDI->count = in_RSI;
    make_unsafe_uniq_array_uninitialized<bool>(in_stack_ffffffffffffffe8);
    unique_ptr<bool[],_std::default_delete<bool>,_false>::operator=
              ((unique_ptr<bool[],_std::default_delete<bool>,_false> *)in_RDI,
               in_stack_ffffffffffffffd8);
    unique_ptr<bool[],_std::default_delete<bool>,_false>::~unique_ptr
              ((unique_ptr<bool[],_std::default_delete<bool>,_false> *)0x17fbe78);
    Reset(in_RDI);
  }
  return;
}

Assistant:

void OuterJoinMarker::Initialize(idx_t count_p) {
	if (!enabled) {
		return;
	}
	this->count = count_p;
	found_match = make_unsafe_uniq_array_uninitialized<bool>(count);
	Reset();
}